

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::AssignmentExpression::serializeTo(AssignmentExpression *this,ASTSerializer *serializer)

{
  size_t __n;
  
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  ASTSerializer::write(serializer,0xd,"isNonBlocking",(ulong)this->nonBlocking);
  if ((this->op).super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::BinaryOperator>._M_engaged == true) {
    __n = strlen(*(char **)(toString(slang::ast::BinaryOperator)::strings +
                           (long)(int)(this->op).
                                      super__Optional_base<slang::ast::BinaryOperator,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<slang::ast::BinaryOperator>.
                                      _M_payload._M_value * 8));
    ASTSerializer::write(serializer,2,"op",__n);
  }
  if (this->timingControl != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,0xd,"timingControl",(size_t)this->timingControl);
    return;
  }
  return;
}

Assistant:

void AssignmentExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());
    serializer.write("right", right());
    serializer.write("isNonBlocking", isNonBlocking());
    if (op)
        serializer.write("op", toString(*op));
    if (timingControl)
        serializer.write("timingControl", *timingControl);
}